

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  char cVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m256i *ptr;
  __m256i *palVar11;
  __m256i *ptr_00;
  int8_t *ptr_01;
  char cVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int8_t iVar21;
  ulong uVar22;
  __m256i *palVar23;
  long lVar24;
  ulong uVar25;
  int32_t segNum;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  bool bVar31;
  undefined1 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar34 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_avx2_256_8_cold_1();
        }
        else {
          iVar29 = uVar2 - 1;
          uVar27 = (ulong)uVar2 + 0x1f >> 5;
          uVar26 = (uint)uVar27;
          iVar9 = iVar29 / (int)uVar26;
          iVar13 = ppVar4->min;
          iVar30 = -open;
          uVar14 = (uint)(byte)-(char)iVar13;
          if (iVar13 != iVar30 && SBORROW4(iVar13,iVar30) == iVar13 + open < 0) {
            uVar14 = open;
          }
          cVar8 = '~' - (char)ppVar4->max;
          ppVar10 = parasail_result_new();
          if (ppVar10 != (parasail_result_t *)0x0) {
            ppVar10->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar10->flag | 0x20100802;
            ptr = parasail_memalign___m256i(0x20,uVar27);
            palVar11 = parasail_memalign___m256i(0x20,uVar27);
            ptr_00 = parasail_memalign___m256i(0x20,uVar27);
            ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar11 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar13 = s2Len + -1;
              iVar18 = 0x1f - iVar9;
              uVar32 = (undefined1)open;
              auVar39[1] = uVar32;
              auVar39[0] = uVar32;
              auVar39[2] = uVar32;
              auVar39[3] = uVar32;
              auVar39[4] = uVar32;
              auVar39[5] = uVar32;
              auVar39[6] = uVar32;
              auVar39[7] = uVar32;
              auVar39[8] = uVar32;
              auVar39[9] = uVar32;
              auVar39[10] = uVar32;
              auVar39[0xb] = uVar32;
              auVar39[0xc] = uVar32;
              auVar39[0xd] = uVar32;
              auVar39[0xe] = uVar32;
              auVar39[0xf] = uVar32;
              auVar39[0x10] = uVar32;
              auVar39[0x11] = uVar32;
              auVar39[0x12] = uVar32;
              auVar39[0x13] = uVar32;
              auVar39[0x14] = uVar32;
              auVar39[0x15] = uVar32;
              auVar39[0x16] = uVar32;
              auVar39[0x17] = uVar32;
              auVar39[0x18] = uVar32;
              auVar39[0x19] = uVar32;
              auVar39[0x1a] = uVar32;
              auVar39[0x1b] = uVar32;
              auVar39[0x1c] = uVar32;
              auVar39[0x1d] = uVar32;
              auVar39[0x1e] = uVar32;
              auVar39[0x1f] = uVar32;
              uVar32 = (undefined1)gap;
              auVar40[1] = uVar32;
              auVar40[0] = uVar32;
              auVar40[2] = uVar32;
              auVar40[3] = uVar32;
              auVar40[4] = uVar32;
              auVar40[5] = uVar32;
              auVar40[6] = uVar32;
              auVar40[7] = uVar32;
              auVar40[8] = uVar32;
              auVar40[9] = uVar32;
              auVar40[10] = uVar32;
              auVar40[0xb] = uVar32;
              auVar40[0xc] = uVar32;
              auVar40[0xd] = uVar32;
              auVar40[0xe] = uVar32;
              auVar40[0xf] = uVar32;
              auVar40[0x10] = uVar32;
              auVar40[0x11] = uVar32;
              auVar40[0x12] = uVar32;
              auVar40[0x13] = uVar32;
              auVar40[0x14] = uVar32;
              auVar40[0x15] = uVar32;
              auVar40[0x16] = uVar32;
              auVar40[0x17] = uVar32;
              auVar40[0x18] = uVar32;
              auVar40[0x19] = uVar32;
              auVar40[0x1a] = uVar32;
              auVar40[0x1b] = uVar32;
              auVar40[0x1c] = uVar32;
              auVar40[0x1d] = uVar32;
              auVar40[0x1e] = uVar32;
              auVar40[0x1f] = uVar32;
              cVar12 = (char)uVar14 + -0x7f;
              auVar33[1] = cVar12;
              auVar33[0] = cVar12;
              auVar33[2] = cVar12;
              auVar33[3] = cVar12;
              auVar33[4] = cVar12;
              auVar33[5] = cVar12;
              auVar33[6] = cVar12;
              auVar33[7] = cVar12;
              auVar33[8] = cVar12;
              auVar33[9] = cVar12;
              auVar33[10] = cVar12;
              auVar33[0xb] = cVar12;
              auVar33[0xc] = cVar12;
              auVar33[0xd] = cVar12;
              auVar33[0xe] = cVar12;
              auVar33[0xf] = cVar12;
              auVar34[0x10] = cVar12;
              auVar34._0_16_ = auVar33;
              auVar34[0x11] = cVar12;
              auVar34[0x12] = cVar12;
              auVar34[0x13] = cVar12;
              auVar34[0x14] = cVar12;
              auVar34[0x15] = cVar12;
              auVar34[0x16] = cVar12;
              auVar34[0x17] = cVar12;
              auVar34[0x18] = cVar12;
              auVar34[0x19] = cVar12;
              auVar34[0x1a] = cVar12;
              auVar34[0x1b] = cVar12;
              auVar34[0x1c] = cVar12;
              auVar34[0x1d] = cVar12;
              auVar34[0x1e] = cVar12;
              auVar34[0x1f] = cVar12;
              auVar35[1] = cVar8;
              auVar35[0] = cVar8;
              auVar35[2] = cVar8;
              auVar35[3] = cVar8;
              auVar35[4] = cVar8;
              auVar35[5] = cVar8;
              auVar35[6] = cVar8;
              auVar35[7] = cVar8;
              auVar35[8] = cVar8;
              auVar35[9] = cVar8;
              auVar35[10] = cVar8;
              auVar35[0xb] = cVar8;
              auVar35[0xc] = cVar8;
              auVar35[0xd] = cVar8;
              auVar35[0xe] = cVar8;
              auVar35[0xf] = cVar8;
              auVar35[0x10] = cVar8;
              auVar35[0x11] = cVar8;
              auVar35[0x12] = cVar8;
              auVar35[0x13] = cVar8;
              auVar35[0x14] = cVar8;
              auVar35[0x15] = cVar8;
              auVar35[0x16] = cVar8;
              auVar35[0x17] = cVar8;
              auVar35[0x18] = cVar8;
              auVar35[0x19] = cVar8;
              auVar35[0x1a] = cVar8;
              auVar35[0x1b] = cVar8;
              auVar35[0x1c] = cVar8;
              auVar35[0x1d] = cVar8;
              auVar35[0x1e] = cVar8;
              auVar35[0x1f] = cVar8;
              auVar36[0] = (undefined1)iVar18;
              auVar36[1] = auVar36[0];
              auVar36[2] = auVar36[0];
              auVar36[3] = auVar36[0];
              auVar36[4] = auVar36[0];
              auVar36[5] = auVar36[0];
              auVar36[6] = auVar36[0];
              auVar36[7] = auVar36[0];
              auVar36[8] = auVar36[0];
              auVar36[9] = auVar36[0];
              auVar36[10] = auVar36[0];
              auVar36[0xb] = auVar36[0];
              auVar36[0xc] = auVar36[0];
              auVar36[0xd] = auVar36[0];
              auVar36[0xe] = auVar36[0];
              auVar36[0xf] = auVar36[0];
              auVar36[0x10] = auVar36[0];
              auVar36[0x11] = auVar36[0];
              auVar36[0x12] = auVar36[0];
              auVar36[0x13] = auVar36[0];
              auVar36[0x14] = auVar36[0];
              auVar36[0x15] = auVar36[0];
              auVar36[0x16] = auVar36[0];
              auVar36[0x17] = auVar36[0];
              auVar36[0x18] = auVar36[0];
              auVar36[0x19] = auVar36[0];
              auVar36[0x1a] = auVar36[0];
              auVar36[0x1b] = auVar36[0];
              auVar36[0x1c] = auVar36[0];
              auVar36[0x1d] = auVar36[0];
              auVar36[0x1e] = auVar36[0];
              auVar36[0x1f] = auVar36[0];
              lVar16 = (long)iVar30;
              uVar22 = 0;
              do {
                lVar28 = 0;
                lVar20 = lVar16;
                do {
                  lVar24 = lVar20;
                  if (s1_beg != 0) {
                    lVar24 = 0;
                  }
                  uVar32 = 0x80;
                  if (-0x80 < lVar24) {
                    uVar32 = (undefined1)lVar24;
                  }
                  *(undefined1 *)((long)&local_80 + lVar28) = uVar32;
                  lVar24 = lVar24 - (ulong)(uint)open;
                  if (lVar24 < -0x7f) {
                    lVar24 = -0x80;
                  }
                  *(char *)((long)&local_a0 + lVar28) = (char)lVar24;
                  lVar28 = lVar28 + 1;
                  lVar20 = lVar20 - uVar27 * (uint)gap;
                } while (lVar28 != 0x20);
                palVar23 = ptr + uVar22;
                (*palVar23)[0] = local_80;
                (*palVar23)[1] = lStack_78;
                (*palVar23)[2] = lStack_70;
                (*palVar23)[3] = lStack_68;
                palVar23 = ptr_00 + uVar22;
                (*palVar23)[0] = local_a0;
                (*palVar23)[1] = lStack_98;
                (*palVar23)[2] = lStack_90;
                (*palVar23)[3] = lStack_88;
                uVar22 = uVar22 + 1;
                lVar16 = lVar16 - (ulong)(uint)gap;
              } while (uVar22 != uVar27);
              *ptr_01 = '\0';
              uVar22 = 1;
              iVar19 = iVar30;
              do {
                iVar21 = -0x80;
                if (-0x80 < iVar19) {
                  iVar21 = (int8_t)iVar19;
                }
                if (s2_beg != 0) {
                  iVar21 = '\0';
                }
                ptr_01[uVar22] = iVar21;
                uVar22 = uVar22 + 1;
                iVar19 = iVar19 - gap;
              } while (s2Len + 1 != uVar22);
              uVar22 = 1;
              if (1 < s2Len) {
                uVar22 = (ulong)(uint)s2Len;
              }
              lVar16 = (ulong)(uVar26 + (uVar26 == 0)) << 5;
              uVar17 = 0;
              auVar36 = vpcmpeqb_avx2(auVar36,_DAT_008d4900);
              auVar41 = ZEXT3264(auVar34);
              auVar37 = ZEXT3264(auVar34);
              auVar38 = ZEXT3264(auVar35);
              iVar19 = iVar13;
              do {
                palVar23 = ptr;
                ptr = palVar11;
                auVar42 = SUB3216(palVar23[uVar26 - 1],0);
                auVar45._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar33;
                auVar45._16_16_ = ZEXT116(0) * auVar34._16_16_ + ZEXT116(1) * auVar42;
                auVar45 = vpalignr_avx2((undefined1  [32])palVar23[uVar26 - 1],auVar45,0xf);
                iVar15 = ppVar4->mapper[(byte)s2[uVar17]];
                auVar42 = vpinsrb_avx(auVar45._0_16_,(uint)(byte)ptr_01[uVar17],0);
                auVar45 = vpblendd_avx2(auVar45,ZEXT1632(auVar42),0xf);
                lVar20 = 0;
                auVar44 = ZEXT3264(auVar34);
                do {
                  auVar46 = vpaddsb_avx2(auVar45,*(undefined1 (*) [32])
                                                  ((long)pvVar3 +
                                                  lVar20 + uVar27 * (long)iVar15 * 0x20));
                  auVar45 = *(undefined1 (*) [32])((long)*ptr_00 + lVar20);
                  auVar43 = auVar44._0_32_;
                  auVar5 = vpmaxsb_avx2(auVar45,auVar43);
                  auVar46 = vpmaxsb_avx2(auVar46,auVar5);
                  *(undefined1 (*) [32])((long)*ptr + lVar20) = auVar46;
                  auVar5 = vpmaxsb_avx2(auVar37._0_32_,auVar46);
                  auVar37 = ZEXT3264(auVar5);
                  auVar5 = vpminsb_avx2(auVar38._0_32_,auVar45);
                  auVar5 = vpminsb_avx2(auVar5,auVar43);
                  auVar5 = vpminsb_avx2(auVar5,auVar46);
                  auVar38 = ZEXT3264(auVar5);
                  auVar46 = vpsubsb_avx2(auVar46,auVar39);
                  auVar45 = vpsubsb_avx2(auVar45,auVar40);
                  auVar45 = vpmaxsb_avx2(auVar45,auVar46);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar20) = auVar45;
                  auVar45 = vpsubsb_avx2(auVar43,auVar40);
                  auVar45 = vpmaxsb_avx2(auVar45,auVar46);
                  auVar44 = ZEXT3264(auVar45);
                  auVar45 = *(undefined1 (*) [32])((long)*palVar23 + lVar20);
                  lVar20 = lVar20 + 0x20;
                } while (lVar16 != lVar20);
                uVar14 = 0;
                do {
                  iVar15 = iVar30;
                  if (s2_beg == 0) {
                    iVar15 = ptr_01[uVar17 + 1] - open;
                  }
                  if (iVar15 < -0x7f) {
                    iVar15 = -0x80;
                  }
                  auVar46._0_16_ = ZEXT116(0) * auVar44._0_16_ + ZEXT116(1) * auVar33;
                  auVar46._16_16_ = ZEXT116(0) * auVar34._16_16_ + ZEXT116(1) * auVar44._0_16_;
                  auVar45 = vpalignr_avx2(auVar44._0_32_,auVar46,0xf);
                  auVar42 = vpinsrb_avx(auVar45._0_16_,iVar15,0);
                  auVar45 = vpblendd_avx2(auVar45,ZEXT1632(auVar42),0xf);
                  auVar44 = ZEXT3264(auVar45);
                  bVar31 = true;
                  uVar25 = 1;
                  lVar20 = 0;
                  do {
                    auVar45 = vpmaxsb_avx2(auVar44._0_32_,
                                           *(undefined1 (*) [32])((long)*ptr + lVar20));
                    *(undefined1 (*) [32])((long)*ptr + lVar20) = auVar45;
                    auVar5 = vpminsb_avx2(auVar38._0_32_,auVar45);
                    auVar38 = ZEXT3264(auVar5);
                    auVar46 = vpmaxsb_avx2(auVar37._0_32_,auVar45);
                    auVar37 = ZEXT3264(auVar46);
                    auVar45 = vpsubsb_avx2(auVar45,auVar39);
                    auVar43 = vpsubsb_avx2(auVar44._0_32_,auVar40);
                    auVar44 = ZEXT3264(auVar43);
                    auVar45 = vpcmpgtb_avx2(auVar43,auVar45);
                    if ((((((((((((((((((((((((((((((((auVar45 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar45 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar45 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar45 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar45 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar45 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar45 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar45 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar45 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar45 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar45 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar45 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar45 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar45 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar45 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar45 >> 0x7f,0) == '\0')
                                      && (auVar45 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar45 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar45 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar45 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar45 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar45 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar45 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar45 >> 0xbf,0) == '\0') &&
                              (auVar45 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar45 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar45 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar45 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar45 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar45 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar45 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar45[0x1f]) break;
                    bVar31 = uVar25 < uVar27;
                    lVar20 = lVar20 + 0x20;
                    uVar25 = uVar25 + 1;
                  } while (lVar16 != lVar20);
                } while ((!bVar31) && (bVar31 = uVar14 < 0x1f, uVar14 = uVar14 + 1, bVar31));
                auVar45 = vpcmpgtb_avx2((undefined1  [32])ptr[(uint)(iVar29 % (int)uVar26)],
                                        auVar41._0_32_);
                auVar45 = vpand_avx2(auVar45,auVar36);
                auVar43 = vpmaxsb_avx2((undefined1  [32])ptr[(uint)(iVar29 % (int)uVar26)],
                                       auVar41._0_32_);
                auVar41 = ZEXT3264(auVar43);
                if ((((((((((((((((((((((((((((((((auVar45 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar45 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar45 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar45 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar45 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar45 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar45 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar45 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar45 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar45 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar45 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar45 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar45 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar45 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar45 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar45 >> 0x7f,0) != '\0') ||
                                  (auVar45 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar45 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar45 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar45 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar45 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar45 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar45 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar45 >> 0xbf,0) != '\0') ||
                          (auVar45 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar45 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar45 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar45 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar45 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar45 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar45 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar45[0x1f] < '\0') {
                  iVar19 = (int)uVar17;
                }
                uVar17 = uVar17 + 1;
                palVar11 = palVar23;
                if (uVar17 == uVar22) {
                  if ((s2_end != 0) && (cVar12 = auVar43[0x17], iVar9 < 0x1f)) {
                    iVar30 = 1;
                    if (1 < iVar18) {
                      iVar30 = iVar18;
                    }
                    do {
                      auVar39 = auVar41._0_32_;
                      auVar36 = vperm2i128_avx2(auVar39,auVar39,8);
                      auVar36 = vpalignr_avx2(auVar39,auVar36,0xf);
                      cVar12 = auVar36[0x17];
                      auVar41 = ZEXT3264(auVar36);
                      iVar30 = iVar30 + -1;
                    } while (iVar30 != 0);
                  }
                  iVar30 = iVar29;
                  if ((s1_end != 0) && (((ulong)uVar2 + 0x1f & 0x7fffffe0) != 0)) {
                    uVar27 = 0;
                    do {
                      iVar15 = ((uint)uVar27 & 0x1f) * uVar26 + ((uint)(uVar27 >> 5) & 0x7ffffff);
                      iVar6 = iVar19;
                      iVar7 = iVar30;
                      cVar8 = cVar12;
                      if ((iVar15 < (int)uVar2) &&
                         (cVar1 = *(char *)((long)*ptr + uVar27), iVar6 = iVar13, iVar7 = iVar15,
                         cVar8 = cVar1, cVar1 <= cVar12)) {
                        if (iVar30 <= iVar15) {
                          iVar15 = iVar30;
                        }
                        if (iVar19 != iVar13) {
                          iVar15 = iVar30;
                        }
                        iVar6 = iVar19;
                        iVar7 = iVar30;
                        cVar8 = cVar12;
                        if (cVar1 == cVar12) {
                          iVar7 = iVar15;
                        }
                      }
                      cVar12 = cVar8;
                      iVar30 = iVar7;
                      iVar19 = iVar6;
                      uVar27 = uVar27 + 1;
                    } while ((uVar26 & 0x3ffffff) << 5 != (int)uVar27);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    cVar12 = SUB321(ptr[(uint)(iVar29 % (int)uVar26)],0x17);
                    auVar37 = ZEXT3264((undefined1  [32])ptr[(uint)(iVar29 % (int)uVar26)]);
                    iVar19 = iVar13;
                    iVar30 = iVar29;
                    if (iVar9 < 0x1f) {
                      iVar9 = 1;
                      if (1 < iVar18) {
                        iVar9 = iVar18;
                      }
                      do {
                        auVar39 = auVar37._0_32_;
                        auVar36 = vperm2i128_avx2(auVar39,auVar39,0x28);
                        auVar36 = vpalignr_avx2(auVar39,auVar36,0xf);
                        cVar12 = auVar36[0x17];
                        auVar37 = ZEXT3264(auVar36);
                        iVar9 = iVar9 + -1;
                      } while (iVar9 != 0);
                    }
                  }
                  auVar34 = vpcmpgtb_avx2(auVar34,auVar5);
                  auVar35 = vpcmpgtb_avx2(auVar46,auVar35);
                  auVar34 = vpor_avx2(auVar35,auVar34);
                  if ((((((((((((((((((((((((((((((((auVar34 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar34 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar34 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar34 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar34 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar34 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar34 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar34 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar34 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar34 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar34 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar34 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar34 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar34 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar34 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar34 >> 0x7f,0) != '\0')
                                    || (auVar34 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar34 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar34 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar34 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar34 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar34 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar34 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar34 >> 0xbf,0) != '\0') ||
                            (auVar34 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar34 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar34 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar34 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar34 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar34 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar34[0x1f] < '\0') {
                    *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                    cVar12 = '\0';
                    iVar19 = 0;
                    iVar30 = 0;
                  }
                  ppVar10->score = (int)cVar12;
                  ppVar10->end_query = iVar30;
                  ppVar10->end_ref = iVar19;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar23);
                  parasail_free(ptr);
                  return ppVar10;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi8(_mm256_set1_epi8(position),
            _mm256_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15,16,17,18,19,20,21,22,23,24,25,26,27,28,29,30,31));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm256_max_epi8(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl(vMaxH, 31);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}